

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kevent.c
# Opt level: O0

char * kevent_dump(kevent *kev)

{
  ulong uVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  ulong *in_RDI;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  pcVar2 = (char *)__tls_get_addr(&PTR_00110fd0);
  uVar1 = *in_RDI;
  pcVar3 = kevent_filter_dump((kevent *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  pcVar4 = kevent_flags_dump((kevent *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                            );
  pcVar5 = kevent_fflags_dump((kevent *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  snprintf(pcVar2,0x863,"{ ident=%i, filter=%s, %s, %s, data=%d, udata=%p }",uVar1 & 0xffffffff,
           pcVar3,pcVar4,pcVar5,(int)in_RDI[2],in_RDI[3]);
  pcVar2 = (char *)__tls_get_addr(&PTR_00110fd0);
  return pcVar2;
}

Assistant:

const char *
kevent_dump(const struct kevent *kev)
{
    static __thread char buf[2147];

    snprintf((char *) buf, sizeof(buf),
            "{ ident=%i, filter=%s, %s, %s, data=%d, udata=%p }",
            (u_int) kev->ident,
            kevent_filter_dump(kev),
            kevent_flags_dump(kev),
            kevent_fflags_dump(kev),
            (int) kev->data,
            kev->udata);

    return ((const char *) buf);
}